

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_column_writer.cpp
# Opt level: O3

void __thiscall
duckdb::PrimitiveColumnWriter::NextPage
          (PrimitiveColumnWriter *this,PrimitiveColumnWriterState *state)

{
  idx_t offset;
  idx_t count;
  idx_t in_RAX;
  ulong uVar1;
  reference pvVar2;
  reference pvVar3;
  type temp_writer;
  idx_t iVar4;
  optional_idx local_38;
  
  local_38.index = in_RAX;
  if (state->current_page == 0) {
    iVar4 = 0;
  }
  else {
    FlushPage(this,state);
    iVar4 = state->current_page;
  }
  uVar1 = ((long)(state->write_info).
                 super_vector<duckdb::PageWriteInformation,_std::allocator<duckdb::PageWriteInformation>_>
                 .
                 super__Vector_base<duckdb::PageWriteInformation,_std::allocator<duckdb::PageWriteInformation>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(state->write_info).
                 super_vector<duckdb::PageWriteInformation,_std::allocator<duckdb::PageWriteInformation>_>
                 .
                 super__Vector_base<duckdb::PageWriteInformation,_std::allocator<duckdb::PageWriteInformation>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 5) * -0xf0f0f0f0f0f0f0f;
  if (iVar4 < uVar1) {
    pvVar2 = vector<duckdb::PageInformation,_true>::operator[](&state->page_info,iVar4);
    pvVar3 = vector<duckdb::PageWriteInformation,_true>::operator[]
                       (&state->write_info,state->current_page);
    state->current_page = state->current_page + 1;
    temp_writer = unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true>
                  ::operator*(&pvVar3->temp_writer);
    WriteLevels(&temp_writer->super_WriteStream,&(state->super_ColumnWriterState).repetition_levels,
                ((this->super_ColumnWriter).column_schema)->max_repeat,pvVar2->offset,
                pvVar2->row_count,(optional_idx)0xffffffffffffffff);
    iVar4 = ((this->super_ColumnWriter).column_schema)->max_define;
    offset = pvVar2->offset;
    count = pvVar2->row_count;
    optional_idx::optional_idx
              (&local_38,
               (state->super_ColumnWriterState).parent_null_count +
               (state->super_ColumnWriterState).null_count);
    WriteLevels(&temp_writer->super_WriteStream,&(state->super_ColumnWriterState).definition_levels,
                iVar4,offset,count,local_38);
  }
  else {
    state->current_page = uVar1 + 1;
  }
  return;
}

Assistant:

void PrimitiveColumnWriter::NextPage(PrimitiveColumnWriterState &state) {
	if (state.current_page > 0) {
		// need to flush the current page
		FlushPage(state);
	}
	if (state.current_page >= state.write_info.size()) {
		state.current_page = state.write_info.size() + 1;
		return;
	}
	auto &page_info = state.page_info[state.current_page];
	auto &write_info = state.write_info[state.current_page];
	state.current_page++;

	auto &temp_writer = *write_info.temp_writer;

	// write the repetition levels
	WriteLevels(temp_writer, state.repetition_levels, MaxRepeat(), page_info.offset, page_info.row_count);

	// write the definition levels
	WriteLevels(temp_writer, state.definition_levels, MaxDefine(), page_info.offset, page_info.row_count,
	            state.null_count + state.parent_null_count);
}